

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generateList.hpp
# Opt level: O2

vector<double,_std::allocator<double>_> *
njoy::ENDFtk::section::Type<2,_151>::BreitWignerReichMooreLValueBase::generateList
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          vector<double,_std::allocator<double>_> *energies,
          vector<double,_std::allocator<double>_> *spins,
          vector<double,_std::allocator<double>_> *column1,
          vector<double,_std::allocator<double>_> *column2,
          vector<double,_std::allocator<double>_> *column3,
          vector<double,_std::allocator<double>_> *column4)

{
  long lVar1;
  undefined8 *puVar2;
  ulong uVar3;
  char *in_stack_ffffffffffffffb8;
  
  uVar3 = (long)(energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3;
  lVar1 = (long)(spins->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(spins->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if ((((lVar1 >> 3 == (uVar3 & 0xffffffff)) &&
       ((long)(column1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(column1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start == lVar1)) &&
      ((long)(column2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(column2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start == lVar1)) &&
     (((long)(column3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(column3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start == lVar1 &&
      ((long)(column4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(column4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start == lVar1)))) {
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    for (lVar1 = 0; (uVar3 & 0xffffffff) << 3 != lVar1; lVar1 = lVar1 + 8) {
      std::vector<double,_std::allocator<double>_>::push_back
                (__return_storage_ptr__,
                 (value_type_conflict *)
                 ((long)(energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar1));
      std::vector<double,_std::allocator<double>_>::push_back
                (__return_storage_ptr__,
                 (value_type_conflict *)
                 ((long)(spins->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar1));
      std::vector<double,_std::allocator<double>_>::push_back
                (__return_storage_ptr__,
                 (value_type_conflict *)
                 ((long)(column1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar1));
      std::vector<double,_std::allocator<double>_>::push_back
                (__return_storage_ptr__,
                 (value_type_conflict *)
                 ((long)(column2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar1));
      std::vector<double,_std::allocator<double>_>::push_back
                (__return_storage_ptr__,
                 (value_type_conflict *)
                 ((long)(column3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar1));
      std::vector<double,_std::allocator<double>_>::push_back
                (__return_storage_ptr__,
                 (value_type_conflict *)
                 ((long)(column4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar1));
    }
    return __return_storage_ptr__;
  }
  tools::Log::info<char_const*>(in_stack_ffffffffffffffb8);
  tools::Log::info<char_const*,unsigned_int>("NRS value: {}",(uint)uVar3);
  tools::Log::info<char_const*,unsigned_long>
            ("energies.size(): {}",
             (long)(energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  tools::Log::info<char_const*,unsigned_long>
            ("spins.size(): {}",
             (long)(spins->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(spins->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  tools::Log::info<char_const*,unsigned_long>
            ("column1.size(): {}",
             (long)(column1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(column1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  tools::Log::info<char_const*,unsigned_long>
            ("column2.size(): {}",
             (long)(column2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(column2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  tools::Log::info<char_const*,unsigned_long>
            ("column3.size(): {}",
             (long)(column3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(column3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  tools::Log::info<char_const*,unsigned_long>
            ("column4.size(): {}",
             (long)(column4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(column4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = getenv;
  __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static std::vector< double >
generateList( std::vector< double >&& energies,
              std::vector< double >&& spins,
              std::vector< double >&& column1,
              std::vector< double >&& column2,
              std::vector< double >&& column3,
              std::vector< double >&& column4 ) {

  unsigned int nrs = energies.size();
  if ( ( spins.size() != nrs ) or ( column1.size() != nrs ) or
       ( column2.size() != nrs ) or ( column3.size() != nrs ) or
       ( column4.size() != nrs ) ) {

    Log::info( "The number of resonances and the resonance parameters are not "
               "consistent" );
    Log::info( "NRS value: {}", nrs );
    Log::info( "energies.size(): {}", energies.size() );
    Log::info( "spins.size(): {}", spins.size() );
    Log::info( "column1.size(): {}", column1.size() );
    Log::info( "column2.size(): {}", column2.size() );
    Log::info( "column3.size(): {}", column3.size() );
    Log::info( "column4.size(): {}", column4.size() );
    throw std::exception();
  }

  std::vector< double > list;
  for ( unsigned int i = 0; i < nrs; ++i ) {

    list.push_back( energies[i] );
    list.push_back( spins[i] );
    list.push_back( column1[i] );
    list.push_back( column2[i] );
    list.push_back( column3[i] );
    list.push_back( column4[i] );
  }
  return list;
}